

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O1

void __thiscall
embree::RegressionTask::RegressionTask
          (RegressionTask *this,Test *test,uint sceneIndex,uint sceneCount,uint threadCount,
          bool cancelBuild)

{
  this->sceneIndex = sceneIndex;
  this->sceneCount = sceneCount;
  this->test = test;
  (this->scene).ptr = (VerifyScene *)0x0;
  BarrierSys::BarrierSys(&this->barrier,0);
  this->numActiveThreads = 0;
  this->cancelBuild = cancelBuild;
  (this->errorCounter).super___atomic_base<unsigned_long>._M_i = 0;
  BarrierSys::init(&this->barrier,(EVP_PKEY_CTX *)(ulong)threadCount);
  (this->sampler).s = 0xff19274a;
  return;
}

Assistant:

RegressionTask (VerifyApplication::Test* test, unsigned int sceneIndex, unsigned int sceneCount, unsigned int threadCount, bool cancelBuild)
      : sceneIndex(sceneIndex), sceneCount(sceneCount), test(test), scene(nullptr), numActiveThreads(0), cancelBuild(cancelBuild), errorCounter(0) 
    { 
      barrier.init(threadCount); 
      RandomSampler_init(sampler,0);
    }